

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall pbrt::ScratchBuffer::~ScratchBuffer(ScratchBuffer *this)

{
  memory_resource *pmVar1;
  
  pmVar1 = pstd::pmr::new_delete_resource();
  if (this->ptr != (uint8_t *)0x0) {
    (*pmVar1->_vptr_memory_resource[3])(pmVar1,this->ptr,(long)this->allocatedBytes,0x40);
  }
  return;
}

Assistant:

~ScratchBuffer() { Allocator().deallocate_bytes(ptr, allocatedBytes, align); }